

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O3

StrScanFmt
strscan_bin(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex2,int32_t neg,uint32_t dig)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  if (dig < 0x41 && ex2 == 0) {
    if (dig == 0) {
      uVar2 = 0;
    }
    else {
      lVar5 = 0;
      uVar2 = 0;
      do {
        if ((p[lVar5] & 0xfe) != 0x30) {
          return STRSCAN_ERROR;
        }
        uVar2 = (ulong)(p[lVar5] & 1) + uVar2 * 2;
        lVar5 = lVar5 + 1;
      } while (dig != (uint32_t)lVar5);
    }
    if (fmt - STRSCAN_I64 < 2) {
      uVar4 = -uVar2;
      if (neg == 0) {
        uVar4 = uVar2;
      }
      o->u64 = uVar4;
      return fmt;
    }
    uVar1 = (uint)uVar2;
    if (fmt != STRSCAN_U32) {
      if (fmt != STRSCAN_INT) {
LAB_00127f9e:
        bVar6 = uVar2 >> 0x3e != 0;
        uVar4 = (ulong)(uVar1 & 3) | uVar2 >> 2;
        if (!bVar6) {
          uVar4 = uVar2;
        }
        strscan_double(uVar4,o,(uint)bVar6 * 2,neg);
        return fmt;
      }
      if (((opt & 2) == 0) && (uVar2 < (neg | 0x80000000))) {
        uVar3 = -uVar1;
        if (neg == 0) {
          uVar3 = uVar1;
        }
        (o->field_4).i = uVar3;
        return STRSCAN_INT;
      }
      fmt = STRSCAN_NUM;
      if ((opt & 0x10) == 0) goto LAB_00127f9e;
    }
    if (dig < 0x21) {
      uVar3 = -uVar1;
      if (neg == 0) {
        uVar3 = uVar1;
      }
      (o->field_4).i = uVar3;
      return STRSCAN_U32;
    }
  }
  return STRSCAN_ERROR;
}

Assistant:

static StrScanFmt strscan_bin(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex2, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;
  uint32_t i;

  if (ex2 || dig > 64) return STRSCAN_ERROR;

  /* Scan binary digits. */
  for (i = dig; i; i--, p++) {
    if ((*p & ~1) != '0') return STRSCAN_ERROR;
    x = (x << 1) | (*p & 1);
  }

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
      o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
      return STRSCAN_INT;  /* Fast path for 32 bit integers. */
    }
    if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; break; }
    /* fallthrough */
  case STRSCAN_U32:
    if (dig > 32) return STRSCAN_ERROR;
    o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
    return STRSCAN_U32;
  case STRSCAN_I64:
  case STRSCAN_U64:
    o->u64 = neg ? ~x+1u : x;
    return fmt;
  default:
    break;
  }

  /* Reduce range, then convert to double. */
  if ((x & U64x(c0000000,0000000))) { x = (x >> 2) | (x & 3); ex2 += 2; }
  strscan_double(x, o, ex2, neg);
  return fmt;
}